

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_view_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitTest_x_iutest_x_StringView_Test::iu_UnitTest_x_iutest_x_StringView_Test
          (iu_UnitTest_x_iutest_x_StringView_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00134490;
  return;
}

Assistant:

IUTEST(UnitTest, StringView)
{
    ::std::string s = "abc";
    ::iutest::detail::iu_string_view sv1 = "abc";
    ::iutest::detail::iu_string_view sv2 = s;
    ::iutest::detail::iu_string_view sv3 = "ABC";
    IUTEST_EXPECT_EQ(sv1, sv2);
    IUTEST_EXPECT_EQ(sv1, "abc");
    IUTEST_EXPECT_EQ(sv1, s);
    IUTEST_EXPECT_EQ("abc", sv1);
    IUTEST_EXPECT_EQ(s, sv1);

    IUTEST_EXPECT_STREQ(sv1, "abc");
    IUTEST_EXPECT_STREQ("abc", sv2);
    IUTEST_EXPECT_STREQ(sv1, sv2);
    IUTEST_EXPECT_STREQ(s, sv2);
    IUTEST_EXPECT_STREQ(sv1, s);

    IUTEST_EXPECT_NE(sv1, sv3);
    IUTEST_EXPECT_NE(sv3, s);
    IUTEST_EXPECT_NE(sv3, "Abc");
    IUTEST_EXPECT_NE("Abc", sv3);
    IUTEST_EXPECT_NE(s, sv3);

    //IUTEST_EXPECT_STRNE("Abc", sv1);
}